

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<unsigned_int>::setCapacity(Vector<unsigned_int> *this,size_t newSize)

{
  uint *puVar1;
  ArrayBuilder<unsigned_int> newBuilder;
  ArrayBuilder<unsigned_int> local_30;
  
  puVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)puVar1 >> 2)) {
    (this->builder).pos = puVar1 + newSize;
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<unsigned_int>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<unsigned_int>::addAll<kj::ArrayBuilder<unsigned_int>>(&local_30,&this->builder);
  ArrayBuilder<unsigned_int>::operator=(&this->builder,&local_30);
  ArrayBuilder<unsigned_int>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }